

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O2

void __thiscall
singleParticleSpectra::calculate_three_particle_correlation_deltaeta
          (singleParticleSpectra *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Q1_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Q1_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Q2_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Q2_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Q3_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Q3_imag,int flag,int flag_ch,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *corr_rap,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *corr_rap_err)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  long lVar5;
  pointer pvVar6;
  pointer pvVar7;
  void *pvVar8;
  ostream *this_00;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  pretty_ostream *this_01;
  long lVar12;
  ulong uVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  allocator local_115;
  int local_114;
  long local_110;
  pointer local_108;
  pointer local_100;
  int local_f8;
  uint local_f4;
  singleParticleSpectra *local_f0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_e8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_e0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_d8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_d0;
  long local_c8;
  pointer local_c0;
  pointer local_b8;
  int *local_b0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_a8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_a0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_98;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  string local_50;
  
  local_a0 = corr_rap_err;
  local_a8 = corr_rap;
  local_114 = flag_ch;
  local_d8 = event_Q3_imag;
  uVar4 = this->N_rap;
  uVar13 = 0xffffffffffffffff;
  if (-1 < (long)(int)uVar4) {
    uVar13 = (long)(int)uVar4 * 8;
  }
  local_e8 = event_Q2_real;
  local_e0 = event_Q2_imag;
  local_d0 = event_Q3_real;
  local_98 = event_Q1_real;
  local_90 = event_Q1_imag;
  pvVar8 = operator_new__(uVar13);
  local_b0 = &this->order_max;
  local_78 = 0;
  if (0 < (int)uVar4) {
    local_78 = (ulong)uVar4;
  }
  local_f8 = this->order_max;
  local_88 = (ulong)(uint)this->num_corr;
  if (this->num_corr < 1) {
    local_88 = 0;
  }
  local_c8 = local_78 * 0x18;
  uVar13 = 0;
  do {
    local_f0 = this;
    if (uVar13 == local_88) {
      operator_delete__(pvVar8);
      return;
    }
    lVar16 = (long)(int)(&DAT_00146ae0)[uVar13];
    lVar17 = (long)(int)(&DAT_00146b10)[uVar13];
    lVar11 = lVar17 + lVar16;
    iVar20 = (int)lVar11;
    local_80 = uVar13;
    if (local_f8 < iVar20) {
      this_01 = &this->messager;
      std::operator<<((ostream *)this_01,"Error: the vn needed for three-particle correlation ");
      std::operator<<((ostream *)this_01,"is not computed, order_max = ");
      this_00 = (ostream *)pretty_ostream::operator<<(this_01,local_b0);
      std::operator<<(this_00,"n+m = ");
      std::ostream::operator<<(this_00,iVar20);
      std::operator<<(this_00,". Make sure order_max > n+m!");
      std::__cxx11::string::string((string *)&local_50,"error",&local_115);
      pretty_ostream::flush(this_01,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      exit(1);
    }
    lVar14 = (long)iVar20;
    if (flag == 1) {
      dVar21 = 0.0;
      dVar22 = 0.0;
      dVar24 = 0.0;
      for (lVar12 = 0; local_c8 != lVar12; lVar12 = lVar12 + 0x18) {
        dVar22 = dVar22 + *(double *)
                           (*(long *)((long)&(((local_d0->
                                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<double,_std::allocator<double>_>).
                                             _M_impl.super__Vector_impl_data + lVar12) + lVar11 * 8)
        ;
        dVar24 = dVar24 + *(double *)
                           (*(long *)((long)&(((local_d8->
                                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<double,_std::allocator<double>_>).
                                             _M_impl.super__Vector_impl_data + lVar12) + lVar11 * 8)
        ;
      }
      dVar23 = 0.0;
    }
    else {
      dVar21 = 0.0;
      dVar23 = 0.0;
      dVar22 = 0.0;
      dVar24 = 0.0;
      if (flag == 2) {
        for (lVar11 = 0; local_c8 != lVar11; lVar11 = lVar11 + 0x18) {
          dVar21 = dVar21 + *(double *)
                             (*(long *)((long)&(((local_e8->
                                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               super__Vector_base<double,_std::allocator<double>_>).
                                               _M_impl.super__Vector_impl_data + lVar11) +
                             lVar14 * 8);
          dVar23 = dVar23 + *(double *)
                             (*(long *)((long)&(((local_e0->
                                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               super__Vector_base<double,_std::allocator<double>_>).
                                               _M_impl.super__Vector_impl_data + lVar11) +
                             lVar14 * 8);
        }
        dVar24 = 0.0;
      }
    }
    for (uVar9 = 0; local_78 != uVar9; uVar9 = uVar9 + 1) {
      *(undefined8 *)((long)pvVar8 + uVar9 * 8) = 0;
    }
    local_b8 = (local_98->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_c0 = (local_90->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_60 = (local_d0->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_68 = (local_d8->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_100 = (local_e8->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    local_108 = (local_e0->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    local_110 = 0;
    uVar9 = 0;
    uVar19 = -(int)(this->rapidity_dis_min / this->drap);
    while (uVar18 = uVar19, uVar10 = uVar9, uVar10 != local_78) {
      local_58 = local_100 + uVar10;
      uVar19 = uVar18;
      for (lVar11 = 0; (ulong)uVar4 * 0x18 - lVar11 != 0; lVar11 = lVar11 + 0x18) {
        if ((int)uVar19 < (int)uVar4 && -1 < (int)uVar19) {
          if (flag == 1) {
            pdVar15 = local_b8[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar12 = *(long *)&local_c0[uVar10].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data;
            dVar26 = 0.0;
            if (local_110 == lVar11 && local_114 == 1) {
              dVar26 = pdVar15[lVar14] * dVar22 + *(double *)(lVar12 + lVar14 * 8) * dVar24;
            }
            dVar27 = pdVar15[lVar16];
            lVar5 = *(long *)((long)&(local_100->super__Vector_base<double,_std::allocator<double>_>
                                     )._M_impl.super__Vector_impl_data + lVar11);
            dVar25 = *(double *)(lVar5 + lVar17 * 8);
            dVar1 = *(double *)(lVar12 + lVar16 * 8);
            lVar12 = *(long *)((long)&(local_108->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data + lVar11);
            dVar2 = *(double *)(lVar12 + lVar17 * 8);
            dVar25 = (((dVar27 * dVar25 - dVar2 * dVar1) * dVar22 +
                      (dVar2 * dVar27 + dVar25 * dVar1) * dVar24) -
                     (dVar27 * *(double *)(lVar5 + lVar16 * 8) +
                     dVar1 * *(double *)(lVar12 + lVar16 * 8))) -
                     (*(double *)
                       (*(long *)&(local_58->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data + lVar17 * 8) *
                      *(double *)
                       (*(long *)((long)&(local_b8->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data + lVar11) + lVar17 * 8) +
                     *(double *)
                      (*(long *)&local_108[uVar10].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + lVar17 * 8) *
                     *(double *)
                      (*(long *)((long)&(local_c0->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data + lVar11) + lVar17 * 8));
            if (1e-15 <= ABS(dVar26)) {
              dVar25 = dVar25 - dVar26;
LAB_00128b08:
              dVar25 = dVar25 + *pdVar15 + *pdVar15;
            }
          }
          else {
            if (flag != 2) goto LAB_00128b24;
            pdVar15 = local_b8[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar12 = *(long *)&local_c0[uVar10].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data;
            dVar27 = 0.0;
            dVar26 = 0.0;
            if (local_110 == lVar11) {
              dVar26 = pdVar15[lVar17] * dVar21 + *(double *)(lVar12 + lVar17 * 8) * dVar23;
            }
            dVar25 = *(double *)
                      (*(long *)((long)&(local_60->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data + lVar11) + lVar14 * 8);
            dVar1 = *(double *)
                     (*(long *)((long)&(local_68->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data + lVar11) + lVar14 * 8);
            if (local_114 == 1) {
              dVar27 = pdVar15[lVar14] * dVar25 + *(double *)(lVar12 + lVar14 * 8) * dVar1;
            }
            dVar2 = pdVar15[lVar16];
            dVar3 = *(double *)(lVar12 + lVar16 * 8);
            dVar25 = ((((dVar2 * dVar21 - dVar23 * dVar3) * dVar25 +
                       (dVar2 * dVar23 + dVar21 * dVar3) * dVar1) -
                      (dVar2 * *(double *)
                                (*(long *)((long)&(local_100->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + lVar11) +
                                lVar16 * 8) +
                      dVar3 * *(double *)
                               (*(long *)((long)&(local_108->
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 )._M_impl.super__Vector_impl_data + lVar11) +
                               lVar16 * 8))) - dVar26) - dVar27;
            if ((1e-15 < ABS(dVar27)) && (1e-15 < ABS(dVar26))) goto LAB_00128b08;
          }
          *(double *)((long)pvVar8 + (ulong)uVar19 * 8) =
               dVar25 + *(double *)((long)pvVar8 + (ulong)uVar19 * 8);
        }
LAB_00128b24:
        uVar19 = uVar19 - 1;
      }
      local_110 = local_110 + 0x18;
      uVar19 = uVar18 + 1;
      local_f4 = uVar18;
      local_70 = uVar10;
      uVar9 = uVar10 + 1;
    }
    pvVar6 = (local_a8->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar7 = (local_a0->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (uVar9 = 0; local_78 != uVar9; uVar9 = uVar9 + 1) {
      dVar21 = *(double *)((long)pvVar8 + uVar9 * 8);
      lVar11 = *(long *)&pvVar6[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data;
      *(double *)(lVar11 + uVar9 * 8) = *(double *)(lVar11 + uVar9 * 8) + dVar21;
      lVar11 = *(long *)&pvVar7[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data;
      *(double *)(lVar11 + uVar9 * 8) = dVar21 * dVar21 + *(double *)(lVar11 + uVar9 * 8);
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void singleParticleSpectra::calculate_three_particle_correlation_deltaeta(
    vector<vector<double>> &event_Q1_real,
    vector<vector<double>> &event_Q1_imag,
    vector<vector<double>> &event_Q2_real,
    vector<vector<double>> &event_Q2_imag,
    vector<vector<double>> &event_Q3_real,
    vector<vector<double>> &event_Q3_imag, int flag, int flag_ch,
    vector<vector<double>> &corr_rap, vector<vector<double>> &corr_rap_err) {
    // C_nmk[0] = C_000 = N(N-1)(N-2) is the number of pairs
    // C_nmk[1] = C_112, C_nmk[2] = C_123, C_nmk[3] = C_224, C_nmk[4] = C_235
    // C_nmk[5] = C_134, C_nmk[6] = C_246, C_nmk[7] = C_336, C_nmk[8] = C_347
    int n[9] = {0, 1, 1, 2, 2, 1, 2, 3, 3};
    int m[9] = {0, 1, 2, 2, 3, 3, 4, 3, 4};
    double *temp_corr = new double[N_rap];
    for (int i = 0; i < num_corr; i++) {
        int k = n[i] + m[i];
        if (k > order_max) {
            messager << "Error: the vn needed for three-particle correlation "
                     << "is not computed, order_max = " << order_max
                     << "n+m = " << k << ". Make sure order_max > n+m!";
            messager.flush("error");
            exit(1);
        }

        double Q2_real = 0.0;
        double Q2_imag = 0.0;
        double Q3_real = 0.0;
        double Q3_imag = 0.0;
        if (flag == 1) {
            for (int j = 0; j < N_rap; j++) {
                Q3_real += event_Q3_real[j][k];
                Q3_imag += event_Q3_imag[j][k];
            }
        } else if (flag == 2) {
            for (int j = 0; j < N_rap; j++) {
                Q2_real += event_Q2_real[j][k];
                Q2_imag += event_Q2_imag[j][k];
            }
        }

        for (int kk = 0; kk < N_rap; kk++) {
            temp_corr[kk] = 0.0;
        }
        for (int ii = 0; ii < N_rap; ii++) {
            for (int jj = 0; jj < N_rap; jj++) {
                int rap_idx =
                    ((ii - jj) - static_cast<int>(rapidity_dis_min / drap));
                if (rap_idx >= 0 && rap_idx < N_rap) {
                    double Qn_Qm_Qkstar = 0.0;
                    double Qn_Qnstar = 0.0;
                    double Qm_Qmstar = 0.0;
                    double Qk_Qkstar = 0.0;
                    if (flag == 1) {
                        Qn_Qm_Qkstar =
                            ((event_Q1_real[ii][n[i]] * event_Q2_real[jj][m[i]]
                              - event_Q1_imag[ii][n[i]]
                                    * event_Q2_imag[jj][m[i]])
                                 * Q3_real
                             + (event_Q1_real[ii][n[i]]
                                    * event_Q2_imag[jj][m[i]]
                                + event_Q1_imag[ii][n[i]]
                                      * event_Q2_real[jj][m[i]])
                                   * Q3_imag);
                        // full overlap between Q2 and Q3 = Q1[n]*conj(Q2[n])
                        Qn_Qnstar =
                            (event_Q1_real[ii][n[i]] * event_Q2_real[jj][n[i]]
                             + event_Q1_imag[ii][n[i]]
                                   * event_Q2_imag[jj][n[i]]);
                        // full overlap between Q1 and Q3 = Q2[m]*conj(Q1[m])
                        Qm_Qmstar =
                            (event_Q2_real[ii][m[i]] * event_Q1_real[jj][m[i]]
                             + event_Q2_imag[ii][m[i]]
                                   * event_Q1_imag[jj][m[i]]);
                        // full overlap between Q1 and Q2 = Q1[k]*conj(Q3[k])
                        if (ii == jj && flag_ch == 1) {
                            Qk_Qkstar =
                                (event_Q1_real[ii][k] * Q3_real
                                 + event_Q1_imag[ii][k] * Q3_imag);
                        }
                        double corr_local;
                        if (fabs(Qk_Qkstar) < 1e-15) {
                            corr_local = Qn_Qm_Qkstar - Qn_Qnstar - Qm_Qmstar;
                        } else {
                            corr_local =
                                (Qn_Qm_Qkstar - Qn_Qnstar - Qm_Qmstar
                                 - Qk_Qkstar + 2. * event_Q1_real[ii][0]);
                        }
                        temp_corr[rap_idx] += corr_local;
                    } else if (flag == 2) {
                        Qn_Qm_Qkstar =
                            ((event_Q1_real[ii][n[i]] * Q2_real
                              - event_Q1_imag[ii][n[i]] * Q2_imag)
                                 * event_Q3_real[jj][k]
                             + (event_Q1_real[ii][n[i]] * Q2_imag
                                + event_Q1_imag[ii][n[i]] * Q2_real)
                                   * event_Q3_imag[jj][k]);
                        // full overlap between Q2 and Q3 = Q1[n]*conj(Q2[n])
                        Qn_Qnstar =
                            (event_Q1_real[ii][n[i]] * event_Q2_real[jj][n[i]]
                             + event_Q1_imag[ii][n[i]]
                                   * event_Q2_imag[jj][n[i]]);
                        // full overlap between Q1 and Q3 = Q2[m]*conj(Q1[m])
                        if (ii == jj) {
                            Qm_Qmstar =
                                (Q2_real * event_Q1_real[jj][m[i]]
                                 + Q2_imag * event_Q1_imag[jj][m[i]]);
                        }
                        // full overlap between Q1 and Q2 = Q1[k]*conj(Q3[k])
                        if (flag_ch == 1) {
                            Qk_Qkstar =
                                (event_Q1_real[ii][k] * event_Q3_real[jj][k]
                                 + event_Q1_imag[ii][k] * event_Q3_imag[jj][k]);
                        }

                        double corr_local;
                        if (fabs(Qk_Qkstar) > 1e-15
                            && fabs(Qm_Qmstar) > 1e-15) {
                            corr_local =
                                (Qn_Qm_Qkstar - Qn_Qnstar - Qm_Qmstar
                                 - Qk_Qkstar + 2. * event_Q1_real[ii][0]);
                        } else {
                            corr_local =
                                (Qn_Qm_Qkstar - Qn_Qnstar - Qm_Qmstar
                                 - Qk_Qkstar);
                        }
                        temp_corr[rap_idx] += corr_local;
                    }
                }
            }
        }
        for (int kk = 0; kk < N_rap; kk++) {
            corr_rap[i][kk] += temp_corr[kk];
            corr_rap_err[i][kk] += temp_corr[kk] * temp_corr[kk];
        }
    }
    delete[] temp_corr;
}